

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgesturemanager.cpp
# Opt level: O2

bool __thiscall QGestureManager::filterEvent(QGestureManager *this,QWidget *receiver,QEvent *event)

{
  _Rb_tree_node_base *t;
  long lVar1;
  bool bVar2;
  _Rb_tree_node_base *p_Var3;
  long *plVar4;
  _Rb_tree_node_base *p_Var5;
  QWidget *pQVar6;
  long in_FS_OFFSET;
  QWidget *local_a0;
  QMultiMap<QObject_*,_Qt::GestureType> local_98;
  undefined1 local_90 [24];
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_90._16_8_ = &local_78;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  local_90._0_8_ = 0x10;
  local_90._8_8_ = 0;
  local_98.d.d.ptr =
       (QExplicitlySharedDataPointerV2<QMapData<std::multimap<QObject_*,_Qt::GestureType,_std::less<QObject_*>,_std::allocator<std::pair<QObject_*const,_Qt::GestureType>_>_>_>_>
        )(totally_ordered_wrapper<QMapData<std::multimap<QObject_*,_Qt::GestureType,_std::less<QObject_*>,_std::allocator<std::pair<QObject_*const,_Qt::GestureType>_>_>_>_*>
          )0x0;
  lVar1 = *(long *)(*(long *)&receiver->field_0x8 + 0x238);
  if ((lVar1 != 0) && (*(long *)(lVar1 + 0x30) != 0)) {
    for (p_Var3 = *(_Rb_tree_node_base **)(lVar1 + 0x20);
        p_Var3 != (_Rb_tree_node_base *)(lVar1 + 0x10);
        p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
      QVarLengthArray<Qt::GestureType,_16LL>::append
                ((QVarLengthArray<Qt::GestureType,_16LL> *)local_90,&p_Var3[1]._M_color);
      local_a0 = receiver;
      QMultiMap<QObject_*,_Qt::GestureType>::insert
                (&local_98,(QObject **)&local_a0,&p_Var3[1]._M_color);
    }
  }
  if (((receiver->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
       super_QFlagsStorage<Qt::WindowType>.i & 1) != 0) {
    pQVar6 = (QWidget *)0x0;
    goto LAB_002d2a74;
  }
  plVar4 = (long *)&receiver->field_0x8;
  do {
    pQVar6 = *(QWidget **)(*plVar4 + 0x10);
LAB_002d2a74:
    if (pQVar6 == (QWidget *)0x0) break;
    plVar4 = (long *)&pQVar6->field_0x8;
    lVar1 = *(long *)(*(long *)&pQVar6->field_0x8 + 0x238);
    p_Var3 = (_Rb_tree_node_base *)0x0;
    if (lVar1 != 0) {
      p_Var3 = *(_Rb_tree_node_base **)(lVar1 + 0x20);
    }
    p_Var5 = (_Rb_tree_node_base *)(lVar1 + 0x10);
    if (lVar1 == 0) {
      p_Var5 = (_Rb_tree_node_base *)0x0;
    }
    for (; p_Var3 != p_Var5; p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
      if ((p_Var3[1].field_0x4 & 1) == 0) {
        t = p_Var3 + 1;
        bVar2 = QVLABase<Qt::GestureType>::contains<Qt::GestureType>
                          ((QVLABase<Qt::GestureType> *)local_90,&t->_M_color);
        if (!bVar2) {
          QVarLengthArray<Qt::GestureType,_16LL>::append
                    ((QVarLengthArray<Qt::GestureType,_16LL> *)local_90,&t->_M_color);
          local_a0 = pQVar6;
          QMultiMap<QObject_*,_Qt::GestureType>::insert
                    (&local_98,(QObject **)&local_a0,&t->_M_color);
        }
      }
    }
  } while (((pQVar6->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
            super_QFlagsStorage<Qt::WindowType>.i & 1) == 0);
  if ((local_98.d.d.ptr ==
       (totally_ordered_wrapper<QMapData<std::multimap<QObject_*,_Qt::GestureType,_std::less<QObject_*>,_std::allocator<std::pair<QObject_*const,_Qt::GestureType>_>_>_>_*>
        )0x0) || (*(size_t *)((long)local_98.d.d.ptr + 0x30) == 0)) {
    bVar2 = false;
  }
  else {
    bVar2 = filterEventThroughContexts(this,&local_98,event);
  }
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::multimap<QObject_*,_Qt::GestureType,_std::less<QObject_*>,_std::allocator<std::pair<QObject_*const,_Qt::GestureType>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2(&local_98.d);
  QVarLengthArray<Qt::GestureType,_16LL>::~QVarLengthArray
            ((QVarLengthArray<Qt::GestureType,_16LL> *)local_90);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QGestureManager::filterEvent(QWidget *receiver, QEvent *event)
{
    QVarLengthArray<Qt::GestureType, 16> types;
    QMultiMap<QObject *, Qt::GestureType> contexts;
    QWidget *w = receiver;
    typedef QMap<Qt::GestureType, Qt::GestureFlags>::const_iterator ContextIterator;
    if (!w->d_func()->gestureContext.isEmpty()) {
        for(ContextIterator it = w->d_func()->gestureContext.constBegin(),
            e = w->d_func()->gestureContext.constEnd(); it != e; ++it) {
            types.push_back(it.key());
            contexts.insert(w, it.key());
        }
    }
    // find all gesture contexts for the widget tree
    w = w->isWindow() ? nullptr : w->parentWidget();
    while (w)
    {
        for (ContextIterator it = w->d_func()->gestureContext.constBegin(),
             e = w->d_func()->gestureContext.constEnd(); it != e; ++it) {
            if (!(it.value() & Qt::DontStartGestureOnChildren)) {
                if (!types.contains(it.key())) {
                    types.push_back(it.key());
                    contexts.insert(w, it.key());
                }
            }
        }
        if (w->isWindow())
            break;
        w = w->parentWidget();
    }
    return contexts.isEmpty() ? false : filterEventThroughContexts(contexts, event);
}